

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O2

void Omega_h::vtk::write_vtkfile_vtu_start_tag(ostream *stream,bool compress)

{
  bool bVar1;
  undefined7 in_register_00000031;
  char *pcVar2;
  
  std::operator<<(stream,"<VTKFile type=\"UnstructuredGrid\" byte_order=\"");
  bVar1 = is_little_endian_cpu();
  pcVar2 = "BigEndian";
  if (bVar1) {
    pcVar2 = "LittleEndian";
  }
  std::operator<<(stream,pcVar2);
  std::operator<<(stream,"\" header_type=\"");
  std::operator<<(stream,"UInt64");
  std::operator<<(stream,"\"");
  if ((int)CONCAT71(in_register_00000031,compress) != 0) {
    std::operator<<(stream," compressor=\"vtkZLibDataCompressor\"");
  }
  std::operator<<(stream,">\n");
  return;
}

Assistant:

void write_vtkfile_vtu_start_tag(std::ostream& stream, bool compress) {
  stream << "<VTKFile type=\"UnstructuredGrid\" byte_order=\"";
  if (is_little_endian_cpu())
    stream << "LittleEndian";
  else
    stream << "BigEndian";
  stream << "\" header_type=\"";
  stream << Traits<std::uint64_t>::name();
  stream << "\"";
#ifdef OMEGA_H_USE_ZLIB
  if (compress) {
    stream << " compressor=\"vtkZLibDataCompressor\"";
  }
#else
  OMEGA_H_CHECK(!compress);
#endif
  stream << ">\n";
}